

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void pbrt::LogFatal(LogLevel level,char *file,int line,char *s)

{
  FILE *__stream;
  uint32_t uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 in_RCX;
  uint in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  float fVar4;
  string shortfile;
  char *fileStart;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff28;
  lock_guard<std::mutex> *in_stack_ffffffffffffff30;
  string *this;
  allocator<char> *__s;
  LogLevel level_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string local_88 [55];
  allocator<char> local_51 [33];
  char *local_30;
  undefined8 local_20;
  uint local_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_30 = strstr((char *)local_10,"pbrt/");
  if (local_30 != (char *)0x0) {
    local_10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_30 + 5);
  }
  __s = local_51;
  this_00 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)__s,(allocator<char> *)local_10);
  level_00 = (LogLevel)((ulong)__s >> 0x20);
  std::allocator<char>::~allocator(local_51);
  __stream = _stderr;
  uVar1 = anon_unknown_3::GetThreadIndex();
  fVar4 = anon_unknown_3::ElapsedSeconds();
  uVar2 = std::__cxx11::string::c_str();
  ToString_abi_cxx11_(level_00);
  this = local_88;
  uVar3 = std::__cxx11::string::c_str();
  fprintf(__stream,"[ tid %03d @ %9.3fs %s:%d ] %s %s\n",(double)fVar4,(ulong)uVar1,uVar2,
          (ulong)local_14,uVar3,local_20);
  std::__cxx11::string::~string(this);
  CheckCallbackScope::Fail();
  abort();
}

Assistant:

void LogFatal(LogLevel level, const char *file, int line, const char *s) {
#ifdef PBRT_IS_GPU_CODE
    Log(LogLevel::Fatal, file, line, s);
    __threadfence();
    asm("trap;");
#else
    static std::mutex mutex;
    std::lock_guard<std::mutex> lock(mutex);

    // cut off everything up to pbrt/
    const char *fileStart = strstr(file, "pbrt/");
    std::string shortfile(fileStart ? (fileStart + 5) : file);
    fprintf(stderr, "[ " LOG_BASE_FMT " %s:%d ] %s %s\n", LOG_BASE_ARGS,
            shortfile.c_str(), line, ToString(level).c_str(), s);

    CheckCallbackScope::Fail();
    abort();
#endif
}